

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

ostream * Catch::TextFlow::operator<<(ostream *os,Column *col)

{
  string *extraout_RDX;
  string *psVar1;
  string *extraout_RDX_00;
  pointer pcVar2;
  string *in_R8;
  bool bVar3;
  const_iterator start;
  const_iterator end;
  string line;
  const_iterator __begin2;
  char local_91;
  string local_90;
  const_iterator local_70;
  
  Column::const_iterator::const_iterator(&local_70,col);
  pcVar2 = (col->m_string).m_string._M_dataplus._M_p + (col->m_string).m_string._M_string_length;
  if ((local_70.m_lineStart.m_it._M_current != pcVar2) || (local_70.m_column != col)) {
    bVar3 = true;
    psVar1 = extraout_RDX;
    do {
      start.m_it._M_current = local_70.m_lineStart.m_it._M_current;
      start.m_string = psVar1;
      end.m_it._M_current = local_70.m_lineEnd.m_it._M_current;
      end.m_string = in_R8;
      Column::const_iterator::addIndentAndSuffix_abi_cxx11_(&local_90,&local_70,start,end);
      if (bVar3) {
        bVar3 = false;
      }
      else {
        local_91 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_91,1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_90._M_dataplus._M_p,local_90._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      Column::const_iterator::operator++(&local_70);
      psVar1 = extraout_RDX_00;
    } while ((local_70.m_lineStart.m_it._M_current != pcVar2) || (local_70.m_column != col));
  }
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream& os, Column const& col ) {
            bool first = true;
            for ( auto line : col ) {
                if ( first ) {
                    first = false;
                } else {
                    os << '\n';
                }
                os << line;
            }
            return os;
        }